

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O0

int lua_closethread(lua_State *L,lua_State *from)

{
  byte bVar1;
  uint local_20;
  TStatus status;
  lua_State *from_local;
  lua_State *L_local;
  
  if (from == (lua_State *)0x0) {
    local_20 = 0;
  }
  else {
    local_20 = from->nCcalls & 0xffff;
  }
  L->nCcalls = local_20;
  bVar1 = luaE_resetthread(L,L->status);
  return (int)bVar1;
}

Assistant:

LUA_API int lua_closethread (lua_State *L, lua_State *from) {
  TStatus status;
  lua_lock(L);
  L->nCcalls = (from) ? getCcalls(from) : 0;
  status = luaE_resetthread(L, L->status);
  lua_unlock(L);
  return APIstatus(status);
}